

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O2

void __thiscall
QKmsDevice::QKmsDevice(QKmsDevice *this,QKmsScreenConfig *screenConfig,QString *path)

{
  QString *this_00;
  QKmsScreenConfig *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  qsizetype qVar5;
  QKmsDevice *this_01;
  long in_FS_OFFSET;
  Data *pDVar6;
  QArrayDataPointer<char> local_60;
  undefined4 local_48;
  undefined4 uStack_44;
  QKmsScreenConfig *pQStack_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  char *local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this->_vptr_QKmsDevice = (_func_int **)&PTR__QKmsDevice_0012bfd0;
  this->m_screenConfig = screenConfig;
  this_00 = &this->m_path;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&this_00->d,&path->d);
  this->m_dri_fd = -1;
  this->m_has_atomic_support = false;
  QThreadStorage<QKmsDevice::AtomicReqs>::QThreadStorage(&this->m_atomicReqs);
  (this->m_planes).d.ptr = (QKmsPlane *)0x0;
  (this->m_planes).d.size = 0;
  *(undefined1 (*) [16])&this->m_crtc_allocator = (undefined1  [16])0x0;
  if ((this->m_path).d.size == 0) {
    pQVar1 = this->m_screenConfig;
    pDVar6 = (pQVar1->m_devicePath).d.d;
    pcVar2 = (pQVar1->m_devicePath).d.ptr;
    qVar3 = (pQVar1->m_devicePath).d.size;
    if (pDVar6 == (Data *)0x0) {
      qVar5 = 0;
      pDVar6 = (Data *)0x0;
    }
    else {
      LOCK();
      (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      qVar5 = (this->m_path).d.size;
    }
    pDVar4 = (this->m_path).d.d;
    pQStack_40 = (QKmsScreenConfig *)(this->m_path).d.ptr;
    (this->m_path).d.d = pDVar6;
    (this->m_path).d.ptr = pcVar2;
    local_48 = SUB84(pDVar4,0);
    uStack_44 = (undefined4)((ulong)pDVar4 >> 0x20);
    (this->m_path).d.size = qVar3;
    uStack_38 = (undefined4)qVar5;
    uStack_34 = (undefined4)((ulong)qVar5 >> 0x20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffffb8);
    qLcKmsDebug();
    if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_48 = 2;
      uStack_44 = 0;
      pQStack_40 = (QKmsScreenConfig *)0x0;
      uStack_38 = 0;
      uStack_34 = 0;
      local_30 = qLcKmsDebug::category.name;
      QString::toLocal8Bit((QByteArray *)&local_60,this_00);
      if (local_60.ptr == (char *)0x0) {
        local_60.ptr = (char *)&QByteArray::_empty;
      }
      QMessageLogger::debug
                ((char *)&stack0xffffffffffffffb8,"Using DRM device %s specified in config file",
                 local_60.ptr);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_60);
    }
    if ((this->m_path).d.size == 0) {
      this_01 = (QKmsDevice *)&stack0xffffffffffffffb8;
      local_48 = 2;
      uStack_34 = 0;
      uStack_44 = 0;
      pQStack_40 = (QKmsScreenConfig *)0x0;
      uStack_38 = 0;
      local_30 = "default";
      QMessageLogger::fatal((char *)this_01,"No DRM device given");
      this_01->_vptr_QKmsDevice = (_func_int **)&PTR__QKmsDevice_0012bfd0;
      threadLocalAtomicReset(this_01);
      QArrayDataPointer<QKmsPlane>::~QArrayDataPointer(&(this_01->m_planes).d);
      QThreadStorageData::~QThreadStorageData(&(this_01->m_atomicReqs).d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this_01->m_path).d);
      return;
    }
  }
  else {
    qLcKmsDebug();
    if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_48 = 2;
      uStack_44 = 0;
      pQStack_40 = (QKmsScreenConfig *)0x0;
      uStack_38 = 0;
      uStack_34 = 0;
      local_30 = qLcKmsDebug::category.name;
      QString::toLocal8Bit((QByteArray *)&local_60,this_00);
      if (local_60.ptr == (char *)0x0) {
        local_60.ptr = (char *)&QByteArray::_empty;
      }
      QMessageLogger::debug
                ((char *)&stack0xffffffffffffffb8,"Using backend-provided DRM device %s",
                 local_60.ptr);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_60);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QKmsDevice::QKmsDevice(QKmsScreenConfig *screenConfig, const QString &path)
    : m_screenConfig(screenConfig)
    , m_path(path)
    , m_dri_fd(-1)
    , m_has_atomic_support(false)
    , m_crtc_allocator(0)
{
    if (m_path.isEmpty()) {
        m_path = m_screenConfig->devicePath();
        qCDebug(qLcKmsDebug, "Using DRM device %s specified in config file", qPrintable(m_path));
        if (m_path.isEmpty())
            qFatal("No DRM device given");
    } else {
        qCDebug(qLcKmsDebug, "Using backend-provided DRM device %s", qPrintable(m_path));
    }
}